

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O2

int __thiscall
webrtc::PushResampler<short>::Resample
          (PushResampler<short> *this,short *src,size_t src_length,short *dst,size_t dst_capacity)

{
  size_t sVar1;
  int iVar2;
  ulong samples_per_channel;
  _Head_base<0UL,_short_*,_false> local_48;
  short *psStack_40;
  
  sVar1 = this->num_channels_;
  iVar2 = -1;
  if (((sVar1 * (long)this->src_sample_rate_hz_) / 100 == src_length) &&
     ((sVar1 * (long)this->dst_sample_rate_hz_) / 100 <= dst_capacity)) {
    if (this->src_sample_rate_hz_ == this->dst_sample_rate_hz_) {
      memcpy(dst,src,src_length * 2);
      iVar2 = (int)src_length;
    }
    else if (sVar1 == 2) {
      samples_per_channel = src_length >> 1;
      local_48._M_head_impl =
           (this->src_left_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
           super__Head_base<0UL,_short_*,_false>._M_head_impl;
      psStack_40 = (this->src_right_)._M_t.
                   super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                   super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                   super__Head_base<0UL,_short_*,_false>._M_head_impl;
      Deinterleave<short>(src,samples_per_channel,2,&local_48._M_head_impl);
      sVar1 = PushSincResampler::Resample
                        ((this->sinc_resampler_)._M_t.
                         super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
                         .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl,
                         (this->src_left_)._M_t.
                         super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                         super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                         super__Head_base<0UL,_short_*,_false>._M_head_impl,samples_per_channel,
                         (this->dst_left_)._M_t.
                         super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                         super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                         super__Head_base<0UL,_short_*,_false>._M_head_impl,dst_capacity >> 1);
      PushSincResampler::Resample
                ((this->sinc_resampler_right_)._M_t.
                 super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
                 .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl,
                 (this->src_right_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>
                 ._M_t.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                 super__Head_base<0UL,_short_*,_false>._M_head_impl,samples_per_channel,
                 (this->dst_right_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>
                 ._M_t.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                 super__Head_base<0UL,_short_*,_false>._M_head_impl,dst_capacity >> 1);
      local_48._M_head_impl =
           (this->dst_left_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
           super__Head_base<0UL,_short_*,_false>._M_head_impl;
      psStack_40 = (this->dst_right_)._M_t.
                   super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                   super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                   super__Head_base<0UL,_short_*,_false>._M_head_impl;
      Interleave<short>(&local_48._M_head_impl,sVar1,this->num_channels_,dst);
      iVar2 = (int)sVar1 * (int)this->num_channels_;
    }
    else {
      sVar1 = PushSincResampler::Resample
                        ((this->sinc_resampler_)._M_t.
                         super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
                         .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl,src
                         ,src_length,dst,dst_capacity);
      iVar2 = (int)sVar1;
    }
  }
  return iVar2;
}

Assistant:

int PushResampler<T>::Resample(const T* src, size_t src_length, T* dst,
                               size_t dst_capacity) {
  const size_t src_size_10ms = src_sample_rate_hz_ * num_channels_ / 100;
  const size_t dst_size_10ms = dst_sample_rate_hz_ * num_channels_ / 100;
  if (src_length != src_size_10ms || dst_capacity < dst_size_10ms)
    return -1;

  if (src_sample_rate_hz_ == dst_sample_rate_hz_) {
    // The old resampler provides this memcpy facility in the case of matching
    // sample rates, so reproduce it here for the sinc resampler.
    memcpy(dst, src, src_length * sizeof(T));
    return static_cast<int>(src_length);
  }
  if (num_channels_ == 2) {
    const size_t src_length_mono = src_length / num_channels_;
    const size_t dst_capacity_mono = dst_capacity / num_channels_;
    T* deinterleaved[] = {src_left_.get(), src_right_.get()};
    Deinterleave(src, src_length_mono, num_channels_, deinterleaved);

    size_t dst_length_mono =
        sinc_resampler_->Resample(src_left_.get(), src_length_mono,
                                  dst_left_.get(), dst_capacity_mono);
    sinc_resampler_right_->Resample(src_right_.get(), src_length_mono,
                                    dst_right_.get(), dst_capacity_mono);

    deinterleaved[0] = dst_left_.get();
    deinterleaved[1] = dst_right_.get();
    Interleave(deinterleaved, dst_length_mono, num_channels_, dst);
    return static_cast<int>(dst_length_mono * num_channels_);
  } else {
    return static_cast<int>(
        sinc_resampler_->Resample(src, src_length, dst, dst_capacity));
  }
}